

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void kratos::output_pkg_debug_info
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
                *generator_map,SystemVerilogCodeGenOptions *options)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  size_t *end;
  _Base_ptr p_Var1;
  undefined8 this_00;
  _Rb_tree_node_base *p_Var2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  Generator *in_RDX;
  string *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  type *f_name;
  _Base_ptr p_Var5;
  basic_string_view<char> bVar6;
  undefined1 auVar7 [16];
  string_view format_str;
  format_args args;
  undefined1 auStack_468 [8];
  ofstream debug_stream;
  stringstream local_260 [8];
  stringstream json;
  map<unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
  info;
  string debug_filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entries;
  _Base_ptr local_50;
  allocator<char> local_31;
  
  end = &info._M_t._M_impl.super__Rb_tree_header._M_node_count;
  this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
         (debug_filename.field_2._M_local_buf + 8);
  p_Var2 = (generator_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var2 != &(generator_map->_M_t)._M_impl.super__Rb_tree_header) {
    extract_debug_info_gen_abi_cxx11_
              ((map<unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
                *)&json.field_0x180,*(kratos **)(p_Var2 + 2),in_RDX);
    std::__cxx11::stringstream::stringstream(local_260);
    poVar3 = std::operator<<((ostream *)&json.field_0x8,"{");
    std::endl<char,std::char_traits<char>>(poVar3);
    local_50 = (_Base_ptr)0x0;
    for (p_Var4 = info._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var4 != (_Rb_tree_node_base *)&info; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4))
    {
      poVar3 = std::operator<<((ostream *)&json.field_0x8,"  \"");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,"\": [");
      debug_filename.field_2._8_8_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,((long)p_Var4[1]._M_left - (long)p_Var4[1]._M_parent) / 0x28);
      local_50 = (_Base_ptr)((long)&local_50->_M_color + 1);
      p_Var1 = p_Var4[1]._M_left;
      for (p_Var5 = p_Var4[1]._M_parent; this_00 = debug_filename.field_2._8_8_, p_Var5 != p_Var1;
          p_Var5 = (_Base_ptr)&p_Var5[1]._M_parent) {
        auStack_468 = *(undefined1 (*) [8])p_Var5;
        _debug_stream = p_Var5->_M_parent;
        bVar6 = fmt::v7::to_string_view<char,_0>("[\"{0}\", {1}]");
        format_str.data_ = (char *)bVar6.size_;
        format_str.size_ = 0x2d;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)auStack_468;
        in_R8 = (string *)auStack_468;
        fmt::v7::detail::vformat_abi_cxx11_((string *)end,(detail *)bVar6.data_,format_str,args);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)end);
        std::__cxx11::string::~string((string *)end);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)end,", ",&local_31);
      string::
      join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((string *)auStack_468,(string *)this_00,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )0x0,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )end,in_R8);
      poVar3 = std::operator<<((ostream *)&json.field_0x8,(string *)auStack_468);
      std::operator<<(poVar3,"]");
      std::__cxx11::string::~string((string *)auStack_468);
      std::__cxx11::string::~string((string *)end);
      poVar3 = (ostream *)&json.field_0x8;
      if (local_50 != info._M_t._M_impl.super__Rb_tree_header._M_header._M_right) {
        poVar3 = std::operator<<((ostream *)&json.field_0x8,",");
      }
      std::endl<char,std::char_traits<char>>(poVar3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this);
    }
    poVar3 = std::operator<<((ostream *)&json.field_0x8,"}");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator+((string *)auStack_468,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1)
                   ,".sv.debug");
    fs::join((string *)end,&options->output_dir,(string *)auStack_468);
    std::__cxx11::string::~string((string *)auStack_468);
    std::ofstream::ofstream((string *)auStack_468,(string *)end,_S_trunc|_S_out|_S_in);
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)auStack_468,(string *)this);
    std::__cxx11::string::~string((string *)this);
    std::ofstream::~ofstream((string *)auStack_468);
    std::__cxx11::string::~string((string *)end);
    std::__cxx11::stringstream::~stringstream(local_260);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>_>_>
                 *)&json.field_0x180);
    auVar7 = std::_Rb_tree_increment(p_Var2);
    in_RDX = auVar7._8_8_;
    p_Var2 = auVar7._0_8_;
  }
  return;
}

Assistant:

void output_pkg_debug_info(const std::map<std::string, Generator*>& generator_map,
                           const SystemVerilogCodeGenOptions& options) {
    for (const auto& [module_name, module_gen] : generator_map) {
        // use unique since we want to keep it close to where it's declared
        auto info = extract_debug_info_gen(module_gen);
        // a simple JSON writer
        std::stringstream json;
        json << "{" << std::endl;
        uint64_t count = 0;
        for (auto const& [line_num, lines] : info) {
            count++;
            json << "  \"" << line_num << "\": [";
            std::vector<std::string> entries;
            entries.reserve(lines.size());
            for (auto const& [f_name, f_ln] : lines) {
                entries.emplace_back(::format("[\"{0}\", {1}]", f_name, f_ln));
            }
            json << string::join(entries.begin(), entries.end(), ", ") << "]";
            if (count != info.size())
                json << "," << std::endl;
            else
                json << std::endl;
        }
        json << "}" << std::endl;
        // just dump it since we don't care about incremental build for debug info
        auto debug_filename = kratos::fs::join(options.output_dir, module_name + ".sv.debug");
        std::ofstream debug_stream(debug_filename, std::ios::in | std::ios::out | std::ios::trunc);
        debug_stream << json.str();
    }
}